

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitterHandle::mousePressEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double in_XMM1_Qa;
  
  if (*(int *)(e + 0x40) == 1) {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    dVar3 = (double)QEventPoint::position();
    if (*(int *)(lVar1 + 0x260) == 1) {
      in_XMM1_Qa = (double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3;
    }
    else {
      in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   in_XMM1_Qa;
    }
    bVar2 = 2147483647.0 < in_XMM1_Qa;
    if (in_XMM1_Qa <= -2147483648.0) {
      in_XMM1_Qa = -2147483648.0;
    }
    *(int *)(lVar1 + 0x264) =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)in_XMM1_Qa);
    *(byte *)(lVar1 + 0x268) = *(byte *)(lVar1 + 0x268) | 4;
    QWidget::update(&this->super_QWidget);
    return;
  }
  return;
}

Assistant:

void QSplitterHandle::mousePressEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (e->button() == Qt::LeftButton) {
        d->mouseOffset = d->pick(e->position().toPoint());
        d->pressed = true;
        update();
    }
}